

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterXsYs<signed_char>,_ImPlot::GetterXsYRef<signed_char>,_ImPlot::TransformerLogLin>
::operator()(ShadedRenderer<ImPlot::GetterXsYs<signed_char>,_ImPlot::GetterXsYRef<signed_char>,_ImPlot::TransformerLogLin>
             *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  ImVec2 IVar1;
  double dVar2;
  char cVar3;
  int iVar4;
  GetterXsYs<signed_char> *pGVar5;
  TransformerLogLin *pTVar6;
  ImPlotPlot *pIVar7;
  GetterXsYRef<signed_char> *pGVar8;
  ImDrawVert *pIVar9;
  ImDrawIdx *pIVar10;
  undefined1 auVar11 [12];
  ImPlotContext *pIVar12;
  ImPlotContext *pIVar13;
  int iVar14;
  long lVar15;
  ushort uVar16;
  ImDrawIdx IVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  double dVar23;
  double dVar24;
  ImVec2 IVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar35;
  float fVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar44;
  undefined1 auVar40 [16];
  
  pIVar12 = GImPlot;
  pGVar5 = this->Getter1;
  pTVar6 = this->Transformer;
  iVar14 = pGVar5->Count;
  lVar15 = (long)(((pGVar5->Offset + prim + 1) % iVar14 + iVar14) % iVar14) * (long)pGVar5->Stride;
  cVar3 = pGVar5->Ys[lVar15];
  dVar23 = log10((double)(int)pGVar5->Xs[lVar15] / (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar13 = GImPlot;
  pIVar7 = pIVar12->CurrentPlot;
  dVar2 = (pIVar7->XAxis).Range.Min;
  iVar14 = pTVar6->YAxis;
  pGVar8 = this->Getter2;
  pTVar6 = this->Transformer;
  iVar4 = pGVar8->Count;
  IVar1 = pIVar12->PixelRange[iVar14].Min;
  fVar26 = (float)(pIVar12->Mx *
                   (((double)(float)(dVar23 / pIVar12->LogDenX) *
                     ((pIVar7->XAxis).Range.Max - dVar2) + dVar2) - dVar2) + (double)IVar1.x);
  fVar28 = (float)(pIVar12->My[iVar14] * ((double)(int)cVar3 - pIVar7->YAxis[iVar14].Range.Min) +
                  (double)IVar1.y);
  dVar2 = pGVar8->YRef;
  dVar24 = log10((double)(int)pGVar8->Xs
                              [(long)(((prim + 1 + pGVar8->Offset) % iVar4 + iVar4) % iVar4) *
                               (long)pGVar8->Stride] / (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar7 = pIVar13->CurrentPlot;
  dVar23 = (pIVar7->XAxis).Range.Min;
  iVar14 = pTVar6->YAxis;
  IVar1 = pIVar13->PixelRange[iVar14].Min;
  IVar25.x = (float)(pIVar13->Mx *
                     (((double)(float)(dVar24 / pIVar13->LogDenX) *
                       ((pIVar7->XAxis).Range.Max - dVar23) + dVar23) - dVar23) + (double)IVar1.x);
  IVar25.y = (float)(pIVar13->My[iVar14] * (dVar2 - pIVar7->YAxis[iVar14].Range.Min) +
                    (double)IVar1.y);
  fVar27 = (this->P12).x;
  fVar29 = (this->P12).y;
  fVar31 = (this->P11).y;
  fVar36 = (this->P11).x;
  uVar21 = -(uint)(fVar31 < fVar29);
  fVar30 = (float)(~-(uint)(fVar27 <= fVar36) & (uint)fVar27 |
                  (uint)fVar36 & -(uint)(fVar27 <= fVar36));
  fVar32 = (float)(~-(uint)(fVar29 <= fVar31) & (uint)fVar29 |
                  (uint)fVar31 & -(uint)(fVar29 <= fVar31));
  fVar35 = (float)(~-(uint)(fVar36 < fVar27) & (uint)fVar27 |
                  (uint)fVar36 & -(uint)(fVar36 < fVar27));
  fVar44 = (float)(~uVar21 & (uint)fVar29 | (uint)fVar31 & uVar21);
  uVar18 = -(uint)(fVar26 <= fVar30);
  uVar19 = -(uint)(fVar28 <= fVar32);
  uVar20 = -(uint)(fVar35 < fVar26);
  uVar22 = -(uint)(fVar44 < fVar28);
  fVar30 = (float)(~uVar18 & (uint)fVar26 | (uint)fVar30 & uVar18);
  fVar32 = (float)(~uVar19 & (uint)fVar28 | (uint)fVar32 & uVar19);
  fVar35 = (float)(~uVar20 & (uint)fVar26 | (uint)fVar35 & uVar20);
  fVar44 = (float)(~uVar22 & (uint)fVar28 | (uint)fVar44 & uVar22);
  uVar18 = -(uint)(IVar25.x <= fVar30);
  uVar19 = -(uint)(IVar25.y <= fVar32);
  uVar20 = -(uint)(fVar35 < IVar25.x);
  uVar22 = -(uint)(fVar44 < IVar25.y);
  auVar34._0_4_ = (uint)fVar30 & uVar18;
  auVar34._4_4_ = (uint)fVar32 & uVar19;
  auVar34._8_4_ = (uint)fVar35 & uVar20;
  auVar34._12_4_ = (uint)fVar44 & uVar22;
  auVar41._0_4_ = ~uVar18 & (uint)IVar25.x;
  auVar41._4_4_ = ~uVar19 & (uint)IVar25.y;
  auVar41._8_4_ = ~uVar20 & (uint)IVar25.x;
  auVar41._12_4_ = ~uVar22 & (uint)IVar25.y;
  auVar41 = auVar41 | auVar34;
  fVar30 = (cull_rect->Min).y;
  auVar43._4_4_ = -(uint)(fVar30 < auVar41._4_4_);
  auVar43._0_4_ = -(uint)((cull_rect->Min).x < auVar41._0_4_);
  auVar11._4_8_ = auVar41._8_8_;
  auVar11._0_4_ = -(uint)(auVar41._4_4_ < fVar30);
  auVar42._0_8_ = auVar11._0_8_ << 0x20;
  auVar42._8_4_ = -(uint)(auVar41._8_4_ < (cull_rect->Max).x);
  auVar42._12_4_ = -(uint)(auVar41._12_4_ < (cull_rect->Max).y);
  auVar43._8_8_ = auVar42._8_8_;
  iVar14 = movmskps((int)cull_rect,auVar43);
  if (iVar14 == 0xf) {
    fVar32 = fVar28 * fVar36 - fVar31 * fVar26;
    fVar35 = IVar25.y * fVar27 - fVar29 * IVar25.x;
    fVar30 = fVar29 - IVar25.y;
    auVar37._4_4_ = fVar30;
    auVar37._0_4_ = fVar30;
    auVar37._8_4_ = fVar30;
    auVar37._12_4_ = fVar30;
    auVar38._4_12_ = auVar37._4_12_;
    auVar38._0_4_ = fVar30 * (fVar36 - fVar26) - (fVar31 - fVar28) * (fVar27 - IVar25.x);
    auVar33._0_4_ = fVar32 * (fVar27 - IVar25.x) - fVar35 * (fVar36 - fVar26);
    auVar33._4_4_ = fVar32 * fVar30 - fVar35 * (fVar31 - fVar28);
    auVar33._8_4_ = fVar28 * 0.0 - IVar25.y * 0.0;
    auVar33._12_4_ = fVar28 * 0.0 - IVar25.y * 0.0;
    auVar40._0_8_ = auVar38._0_8_;
    auVar40._8_4_ = fVar30;
    auVar40._12_4_ = fVar30;
    auVar39._8_8_ = auVar40._8_8_;
    auVar39._4_4_ = auVar38._0_4_;
    auVar39._0_4_ = auVar38._0_4_;
    auVar34 = divps(auVar33,auVar39);
    DrawList->_VtxWritePtr->pos = this->P11;
    DrawList->_VtxWritePtr->uv = *uv;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9->col = this->Col;
    pIVar9[1].pos.x = fVar26;
    pIVar9[1].pos.y = fVar28;
    DrawList->_VtxWritePtr[1].uv = *uv;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9[1].col = this->Col;
    pIVar9[2].pos = auVar34._0_8_;
    DrawList->_VtxWritePtr[2].uv = *uv;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9[2].col = this->Col;
    pIVar9[3].pos = this->P12;
    DrawList->_VtxWritePtr[3].uv = *uv;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9[3].col = this->Col;
    pIVar9[4].pos = IVar25;
    DrawList->_VtxWritePtr[4].uv = *uv;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9[4].col = this->Col;
    DrawList->_VtxWritePtr = pIVar9 + 5;
    uVar18 = DrawList->_VtxCurrentIdx;
    pIVar10 = DrawList->_IdxWritePtr;
    IVar17 = (ImDrawIdx)uVar18;
    *pIVar10 = IVar17;
    uVar16 = (byte)((byte)uVar21 & IVar25.y < fVar28 | -(fVar29 < fVar31) & -(fVar28 < IVar25.y)) &
             1;
    pIVar10[1] = IVar17 + uVar16 + 1;
    pIVar10[2] = IVar17 + 3;
    pIVar10[3] = IVar17 + 1;
    pIVar10[4] = (uVar16 ^ 3) + IVar17;
    pIVar10[5] = IVar17 + 4;
    DrawList->_IdxWritePtr = pIVar10 + 6;
    DrawList->_VtxCurrentIdx = uVar18 + 5;
  }
  (this->P11).x = fVar26;
  (this->P11).y = fVar28;
  (this->P12).x = IVar25.x;
  (this->P12).y = IVar25.y;
  return (char)iVar14 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P21 = Transformer(Getter1(prim+1));
        ImVec2 P22 = Transformer(Getter2(prim+1));
        ImRect rect(ImMin(ImMin(ImMin(P11,P12),P21),P22), ImMax(ImMax(ImMax(P11,P12),P21),P22));
        if (!cull_rect.Overlaps(rect)) {
            P11 = P21;
            P12 = P22;
            return false;
        }
        const int intersect = (P11.y > P12.y && P22.y > P21.y) || (P12.y > P11.y && P21.y > P22.y);
        ImVec2 intersection = Intersection(P11,P21,P12,P22);
        DrawList._VtxWritePtr[0].pos = P11;
        DrawList._VtxWritePtr[0].uv  = uv;
        DrawList._VtxWritePtr[0].col = Col;
        DrawList._VtxWritePtr[1].pos = P21;
        DrawList._VtxWritePtr[1].uv  = uv;
        DrawList._VtxWritePtr[1].col = Col;
        DrawList._VtxWritePtr[2].pos = intersection;
        DrawList._VtxWritePtr[2].uv  = uv;
        DrawList._VtxWritePtr[2].col = Col;
        DrawList._VtxWritePtr[3].pos = P12;
        DrawList._VtxWritePtr[3].uv  = uv;
        DrawList._VtxWritePtr[3].col = Col;
        DrawList._VtxWritePtr[4].pos = P22;
        DrawList._VtxWritePtr[4].uv  = uv;
        DrawList._VtxWritePtr[4].col = Col;
        DrawList._VtxWritePtr += 5;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1 + intersect);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3 - intersect);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 4);
        DrawList._IdxWritePtr += 6;
        DrawList._VtxCurrentIdx += 5;
        P11 = P21;
        P12 = P22;
        return true;
    }